

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::~HttpInputStreamImpl(HttpInputStreamImpl *this)

{
  HttpInputStreamImpl *this_local;
  
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&this->onMessageDone);
  Promise<void>::~Promise(&this->messageReadQueue);
  HttpHeaders::~HttpHeaders(&this->headers);
  Array<char>::~Array(&this->headerBuffer);
  return;
}

Assistant:

explicit HttpInputStreamImpl(AsyncInputStream& inner, HttpHeaderTable& table)
      : inner(inner), headerBuffer(kj::heapArray<char>(MIN_BUFFER)), headers(table) {
  }